

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::setRawData(QByteArray *this,char *data,qsizetype size)

{
  long lVar1;
  long in_RDX;
  long in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffb8;
  qsizetype in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI == 0) || (in_RDX == 0)) {
    clear((QByteArray *)0x4b98b9);
  }
  else {
    fromRawData(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    operator=(in_RDI,in_stack_ffffffffffffffb8);
    ~QByteArray((QByteArray *)0x4b98e8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::setRawData(const char *data, qsizetype size)
{
    if (!data || !size)
        clear();
    else
        *this = fromRawData(data, size);
    return *this;
}